

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestChecks.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_14803::TestCheckEqualFailureIncludesDetails::RunImpl
          (TestCheckEqualFailureIncludesDetails *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  TestResults results;
  TestDetails details;
  RecordingReporter reporter;
  int local_894;
  TestDetails local_890;
  TestResults local_870;
  TestDetails local_858;
  TestReporter local_838;
  undefined4 local_830;
  undefined1 local_82c;
  undefined1 local_72c;
  undefined4 local_62c;
  char local_628 [256];
  int local_528;
  char local_524 [256];
  char local_424 [256];
  undefined1 local_324;
  undefined4 local_224;
  undefined1 local_220;
  undefined1 local_120;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  
  local_838._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150810;
  local_830 = 0;
  local_62c = 0;
  local_528 = 0;
  local_224 = 0;
  local_82c = 0;
  local_72c = 0;
  local_628[0] = '\0';
  local_524[0] = '\0';
  local_424[0] = '\0';
  local_324 = 0;
  local_220 = 0;
  local_120 = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  UnitTest::TestResults::TestResults(&local_870,&local_838);
  UnitTest::TestDetails::TestDetails(&local_858,"mytest","mysuite","file.h",0x65);
  local_890.suiteName._0_4_ = 1;
  local_894 = 2;
  UnitTest::CheckEqual<int,int>(&local_870,(int *)&local_890,&local_894,&local_858);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_890,*ppTVar3,0x5d);
  UnitTest::CheckEqual(pTVar1,"mytest",local_424,&local_890);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_890,*ppTVar3,0x5e);
  UnitTest::CheckEqual(pTVar1,"mysuite",local_524,&local_890);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_890,*ppTVar3,0x5f);
  UnitTest::CheckEqual(pTVar1,"file.h",local_628,&local_890);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_894 = 0x65;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_890,*ppTVar3,0x60);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_894,&local_528,&local_890);
  UnitTest::TestReporter::~TestReporter(&local_838);
  return;
}

Assistant:

TEST(CheckEqualsWithStringsFailsOnDifferentStrings)
{
    char txt1[] = "Hello";
    char txt2[] = "Hallo";
    TestResults results;
    CheckEqual(results, txt1, txt2, TestDetails("", "", "", 0));
    CHECK_EQUAL(1, results.GetFailureCount());
}